

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Status __thiscall
leveldb::Table::InternalGet
          (Table *this,ReadOptions *options,Slice *k,void *arg,
          _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  FilterBlockReader *this_00;
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Iterator *pIVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  code *in_R9;
  long in_FS_OFFSET;
  BlockHandle handle;
  Slice handle_value;
  undefined8 local_80 [2];
  Slice local_70;
  undefined1 local_60 [12];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Table local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->rep_ = (Rep *)0x0;
  pIVar3 = Block::NewIterator((Block *)(*(undefined8 **)options)[0x13],
                              (Comparator *)**(undefined8 **)options);
  (*pIVar3->_vptr_Iterator[5])(pIVar3,arg);
  iVar2 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
  if ((char)iVar2 == '\0') goto LAB_00682290;
  iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
  local_48[0].rep_ = (Rep *)CONCAT44(extraout_var,iVar2);
  this_00 = *(FilterBlockReader **)(*(long *)options + 0x78);
  local_60._8_4_ = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  if (this_00 == (FilterBlockReader *)0x0) {
LAB_006821bd:
    bVar1 = false;
  }
  else {
    BlockHandle::DecodeFrom((BlockHandle *)local_60,(Slice *)(local_60 + 8));
    if ((void *)local_60._0_8_ != (void *)0x0) goto LAB_006821bd;
    bVar1 = FilterBlockReader::KeyMayMatch(this_00,CONCAT44(uStack_54,local_60._8_4_),(Slice *)arg);
    bVar1 = !bVar1;
  }
  if ((this_00 != (FilterBlockReader *)0x0) && ((void *)local_60._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_60._0_8_);
  }
  if (!bVar1) {
    iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
    local_70.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
    pIVar4 = BlockReader(options,(ReadOptions *)k,&local_70);
    (*pIVar4->_vptr_Iterator[5])(pIVar4,arg);
    iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
    if ((char)iVar2 != '\0') {
      iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
      local_70.data_ = (char *)CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
      local_80[0] = CONCAT44(extraout_var_02,iVar2);
      (*in_R9)(handle_result,&local_70,local_80);
    }
    (*pIVar4->_vptr_Iterator[10])(&local_70,pIVar4);
    this->rep_ = (Rep *)local_70.data_;
    (*pIVar4->_vptr_Iterator[1])(pIVar4);
  }
LAB_00682290:
  if (this->rep_ == (Rep *)0x0) {
    (*pIVar3->_vptr_Iterator[10])(local_48,pIVar3);
    this->rep_ = (Rep *)local_48[0];
  }
  (*pIVar3->_vptr_Iterator[1])(pIVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Table::InternalGet(const ReadOptions& options, const Slice& k, void* arg,
                          void (*handle_result)(void*, const Slice&,
                                                const Slice&)) {
  Status s;
  Iterator* iiter = rep_->index_block->NewIterator(rep_->options.comparator);
  iiter->Seek(k);
  if (iiter->Valid()) {
    Slice handle_value = iiter->value();
    FilterBlockReader* filter = rep_->filter;
    BlockHandle handle;
    if (filter != nullptr && handle.DecodeFrom(&handle_value).ok() &&
        !filter->KeyMayMatch(handle.offset(), k)) {
      // Not found
    } else {
      Iterator* block_iter = BlockReader(this, options, iiter->value());
      block_iter->Seek(k);
      if (block_iter->Valid()) {
        (*handle_result)(arg, block_iter->key(), block_iter->value());
      }
      s = block_iter->status();
      delete block_iter;
    }
  }
  if (s.ok()) {
    s = iiter->status();
  }
  delete iiter;
  return s;
}